

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::IFF_PDU::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,IFF_PDU *this)

{
  pointer pKVar1;
  ostream *poVar2;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  pointer pKVar3;
  KStringStream ss;
  KString local_2b0;
  KString local_290;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  Header7::GetAsString_abi_cxx11_(&local_2b0,&this->super_Header);
  poVar2 = std::operator<<(local_1a0,(string *)&local_2b0);
  poVar2 = std::operator<<(poVar2,"-IFF/ATC/NAVAIDS Layer 1 PDU-\n");
  poVar2 = std::operator<<(poVar2,"Emitting Entity ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1f0,&this->m_EmittingEntityID);
  UTILS::IndentString(&local_1d0,&local_1f0,Tabs,in_CL);
  poVar2 = std::operator<<(poVar2,(string *)&local_1d0);
  poVar2 = std::operator<<(poVar2,"Event ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_230,&this->m_EventID);
  UTILS::IndentString(&local_210,&local_230,Tabs_00,in_CL);
  poVar2 = std::operator<<(poVar2,(string *)&local_210);
  poVar2 = std::operator<<(poVar2,"Location:    ");
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_250,&this->m_Location);
  poVar2 = std::operator<<(poVar2,(string *)&local_250);
  DATA_TYPE::SystemIdentifier::GetAsString_abi_cxx11_(&local_270,&this->m_SystemID);
  poVar2 = std::operator<<(poVar2,(string *)&local_270);
  DATA_TYPE::FundamentalOperationalData::GetAsString_abi_cxx11_(&local_290,&this->m_FOD);
  std::operator<<(poVar2,(string *)&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_2b0);
  poVar2 = std::operator<<(local_1a0,"System Designator:    ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8SystemDesignator);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"System Specific Data: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8SystemSpecific);
  std::operator<<(poVar2,"\n");
  pKVar1 = (this->m_vLayers).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar3 = (this->m_vLayers).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar3 != pKVar1; pKVar3 = pKVar3 + 1) {
    (*(pKVar3->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_2b0);
    std::operator<<(local_1a0,(string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

KString IFF_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-IFF/ATC/NAVAIDS Layer 1 PDU-\n"
       << "Emitting Entity ID:\n"
       << IndentString( m_EmittingEntityID.GetAsString(), 1 )
       << "Event ID:\n"
       << IndentString( m_EventID.GetAsString(), 1 )
       << "Location:    " << m_Location.GetAsString()
       << m_SystemID.GetAsString()
       << m_FOD.GetAsString();

	#if DIS_VERSION > 6

	ss << "System Designator:    " << ( KUINT16 )m_ui8SystemDesignator << "\n"
	   << "System Specific Data: " << ( KUINT16 )m_ui8SystemSpecific << "\n";

	#endif

	vector<LyrHdrPtr>::const_iterator citr = m_vLayers.begin();
	vector<LyrHdrPtr>::const_iterator citrEnd = m_vLayers.end();
	for( ; citr != citrEnd; ++citr )
	{
		ss << ( *citr )->GetAsString();
	}

    return ss.str();	
}